

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::PipelineHook>,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::PipelineHook>,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  void *__src;
  ClientHook *pCVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_t sVar9;
  ExceptionOr<kj::Own<capnp::PipelineHook>_> depResult;
  ExceptionOr<kj::Own<capnp::ClientHook>_> local_5c8;
  ExceptionOrValue local_458;
  undefined8 *local_2f8;
  long *plStack_2f0;
  Exception local_2e8;
  Exception local_188;
  
  local_458.exception.ptr.isSet = false;
  local_2f8 = (undefined8 *)0x0;
  plStack_2f0 = (long *)0x0;
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_458);
  plVar8 = plStack_2f0;
  puVar7 = local_2f8;
  uVar6 = local_458.exception.ptr.field_1.value.context.ptr.ptr;
  uVar5 = local_458.exception.ptr.field_1.value.description.content.size_;
  uVar4 = local_458.exception.ptr.field_1.value.description.content.ptr;
  uVar3 = local_458.exception.ptr.field_1.value.ownFile.content.size_;
  uVar2 = local_458.exception.ptr.field_1.value.ownFile.content.ptr;
  if (local_458.exception.ptr.isSet == true) {
    __src = (void *)((long)&local_458.exception.ptr.field_1 + 0x50);
    local_188.ownFile.content.ptr = local_458.exception.ptr.field_1.value.ownFile.content.ptr;
    local_188.ownFile.content.size_ = local_458.exception.ptr.field_1.value.ownFile.content.size_;
    local_188.ownFile.content.disposer =
         local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_458.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_458.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_188.file = local_458.exception.ptr.field_1.value.file;
    local_188.line = local_458.exception.ptr.field_1.value.line;
    local_188.type = local_458.exception.ptr.field_1.value.type;
    local_188.description.content.ptr =
         local_458.exception.ptr.field_1.value.description.content.ptr;
    local_188.description.content.size_ =
         local_458.exception.ptr.field_1.value.description.content.size_;
    local_188.description.content.disposer =
         local_458.exception.ptr.field_1.value.description.content.disposer;
    local_458.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_458.exception.ptr.field_1.value.description.content.size_ = 0;
    local_188.context.ptr.disposer = local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_188.context.ptr.ptr = local_458.exception.ptr.field_1.value.context.ptr.ptr;
    local_458.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_188.trace,__src,0x104);
    local_2e8.ownFile.content.ptr = (char *)uVar2;
    local_2e8.ownFile.content.size_ = uVar3;
    local_2e8.ownFile.content.disposer =
         local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_188.ownFile.content.ptr = (char *)0x0;
    local_188.ownFile.content.size_ = 0;
    local_2e8.file = local_458.exception.ptr.field_1.value.file;
    local_2e8.line = local_458.exception.ptr.field_1.value.line;
    local_2e8.type = local_458.exception.ptr.field_1.value.type;
    local_2e8.description.content.ptr = (char *)uVar4;
    local_2e8.description.content.size_ = uVar5;
    local_2e8.description.content.disposer =
         local_458.exception.ptr.field_1.value.description.content.disposer;
    local_188.description.content.ptr = (char *)0x0;
    local_188.description.content.size_ = 0;
    local_2e8.context.ptr.disposer = local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_2e8.context.ptr.ptr = (Context *)uVar6;
    local_188.context.ptr.ptr = (Context *)0x0;
    memcpy(local_2e8.trace,__src,0x104);
    local_5c8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)uVar2
    ;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = uVar3;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_458.exception.ptr.field_1.value.ownFile.content.disposer;
    local_2e8.ownFile.content.ptr = (char *)0x0;
    local_2e8.ownFile.content.size_ = 0;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_458.exception.ptr.field_1.value.file;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_458.exception.ptr.field_1._32_8_;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)uVar4;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = uVar5;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_458.exception.ptr.field_1.value.description.content.disposer;
    local_2e8.description.content.ptr = (char *)0x0;
    local_2e8.description.content.size_ = 0;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_458.exception.ptr.field_1.value.context.ptr.disposer;
    local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar6;
    local_2e8.context.ptr.ptr = (Context *)0x0;
    memcpy((void *)((long)&local_5c8.super_ExceptionOrValue.exception.ptr.field_1 + 0x50),__src,
           0x104);
    local_5c8.value.ptr.disposer = (Disposer *)0x0;
    local_5c8.value.ptr.ptr = (ClientHook *)0x0;
    Exception::~Exception(&local_2e8);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=
              ((ExceptionOr<kj::Own<capnp::ClientHook>_> *)output,&local_5c8);
    pCVar1 = local_5c8.value.ptr.ptr;
    if (local_5c8.value.ptr.ptr != (ClientHook *)0x0) {
      local_5c8.value.ptr.ptr = (ClientHook *)0x0;
      (**(local_5c8.value.ptr.disposer)->_vptr_Disposer)
                (local_5c8.value.ptr.disposer,
                 (_func_int *)((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2])
                );
    }
    if (local_5c8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    Exception::~Exception(&local_188);
  }
  else if (plStack_2f0 != (long *)0x0) {
    plStack_2f0 = (long *)0x0;
    (**(code **)(*plVar8 + 0x10))(&local_2e8,plVar8,&(this->func).param);
    (**(code **)*puVar7)(puVar7,(long)plVar8 + *(long *)(*plVar8 + -0x10));
    local_5c8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_5c8.value.ptr.disposer = (Disposer *)local_2e8.ownFile.content.ptr;
    local_5c8.value.ptr.ptr = (ClientHook *)local_2e8.ownFile.content.size_;
    local_2e8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=
              ((ExceptionOr<kj::Own<capnp::ClientHook>_> *)output,&local_5c8);
    pCVar1 = local_5c8.value.ptr.ptr;
    if (local_5c8.value.ptr.ptr != (ClientHook *)0x0) {
      local_5c8.value.ptr.ptr = (ClientHook *)0x0;
      (**(local_5c8.value.ptr.disposer)->_vptr_Disposer)
                (local_5c8.value.ptr.disposer,
                 (_func_int *)((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2])
                );
    }
    if (local_5c8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_5c8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    sVar9 = local_2e8.ownFile.content.size_;
    if ((ClientHook *)local_2e8.ownFile.content.size_ != (ClientHook *)0x0) {
      local_2e8.ownFile.content.size_ = 0;
      (***(_func_int ***)local_2e8.ownFile.content.ptr)
                (local_2e8.ownFile.content.ptr,
                 (_func_int *)((long)(_func_int ***)sVar9 + (long)(*(_func_int ***)sVar9)[-2]));
    }
  }
  plVar8 = plStack_2f0;
  if (plStack_2f0 != (long *)0x0) {
    plStack_2f0 = (long *)0x0;
    (**(code **)*local_2f8)(local_2f8,(long)plVar8 + *(long *)(*plVar8 + -0x10));
  }
  if (local_458.exception.ptr.isSet == true) {
    Exception::~Exception(&local_458.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }